

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::Reader::decodeUnicodeCodePoint
          (Reader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char *pcVar1;
  bool bVar2;
  uint *in_RCX;
  long *in_RDX;
  Location *in_RSI;
  Token *in_RDI;
  uint *in_R8;
  uint surrogatePair;
  allocator local_89;
  string local_88 [32];
  uint local_68;
  Location in_stack_ffffffffffffffa8;
  Token *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  Reader *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar3;
  
  bVar2 = decodeUnicodeEscapeSequence
                    ((Reader *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                     in_RSI,(Location)in_RDX,in_RCX);
  if (!bVar2) {
    bVar3 = 0;
    goto LAB_00172783;
  }
  if ((0xd7ff < *in_R8) && (*in_R8 < 0xdc00)) {
    if ((long)in_RCX - *in_RDX < 6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffb0,
                 "additional six characters expected to parse unicode surrogate pair.",
                 (allocator *)&stack0xffffffffffffffaf);
      bVar3 = addError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
      goto LAB_00172783;
    }
    pcVar1 = (char *)*in_RDX;
    *in_RDX = (long)(pcVar1 + 1);
    if ((*pcVar1 != '\\') ||
       (pcVar1 = (char *)*in_RDX, *in_RDX = (long)(pcVar1 + 1), *pcVar1 != 'u')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_88,
                 "expecting another \\u token to begin the second half of a unicode surrogate pair",
                 &local_89);
      bVar3 = addError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      goto LAB_00172783;
    }
    bVar2 = decodeUnicodeEscapeSequence
                      ((Reader *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,(Location)in_RDX,in_RCX);
    if (!bVar2) {
      bVar3 = 0;
      goto LAB_00172783;
    }
    *in_R8 = (*in_R8 & 0x3ff) * 0x400 + 0x10000 + (local_68 & 0x3ff);
  }
  bVar3 = 1;
LAB_00172783:
  return (bool)(bVar3 & 1);
}

Assistant:

bool Reader::decodeUnicodeCodePoint(Token& token,
                                    Location& current,
                                    Location end,
                                    unsigned int& unicode) {

  if (!decodeUnicodeEscapeSequence(token, current, end, unicode))
    return false;
  if (unicode >= 0xD800 && unicode <= 0xDBFF) {
    // surrogate pairs
    if (end - current < 6)
      return addError(
          "additional six characters expected to parse unicode surrogate pair.",
          token,
          current);
    unsigned int surrogatePair;
    if (*(current++) == '\\' && *(current++) == 'u') {
      if (decodeUnicodeEscapeSequence(token, current, end, surrogatePair)) {
        unicode = 0x10000 + ((unicode & 0x3FF) << 10) + (surrogatePair & 0x3FF);
      } else
        return false;
    } else
      return addError("expecting another \\u token to begin the second half of "
                      "a unicode surrogate pair",
                      token,
                      current);
  }
  return true;
}